

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

void storeRange(uint32_t start,uint32_t end,UStringPrepType type,UErrorCode *status)

{
  UBool UVar1;
  char cVar2;
  uint32_t uVar3;
  uint32_t extraout_EAX;
  int32_t iVar4;
  int iVar5;
  uint extraout_EAX_00;
  size_t sVar6;
  UNewDataMemory *pUVar7;
  UHashElement *pUVar8;
  UNewDataMemory *pUVar9;
  int iVar10;
  uint uVar11;
  uint32_t extraout_EDX;
  UNewDataMemory *unaff_RBX;
  uint uVar12;
  UNewDataMemory *pUVar13;
  UNewDataMemory *pUVar14;
  undefined4 in_register_00000034;
  UNewDataMemory *pUVar15;
  UNewTrie *pUVar16;
  char *comment;
  undefined8 *unaff_R12;
  UChar32 UVar17;
  UNewDataMemory *pUVar18;
  UNewDataMemory *pErrorCode;
  char cStack_a9;
  UNewDataMemory *pUStack_a8;
  undefined8 *puStack_a0;
  UNewDataMemory *pUStack_98;
  UNewDataMemory *pUStack_90;
  UNewDataMemory *pUStack_88;
  char cStack_71;
  undefined1 auStack_70 [8];
  UChar32 UStack_68;
  int32_t iStack_64;
  int iStack_60;
  uint uStack_5c;
  UNewDataMemory *pUStack_58;
  UNewDataMemory *pUStack_50;
  UNewDataMemory *pUStack_48;
  
  pUVar9 = (UNewDataMemory *)CONCAT44(in_register_00000034,end);
  uVar12 = type + 0xfff0;
  if ((int)uVar12 < 0x10000) {
    unaff_RBX = (UNewDataMemory *)(ulong)start;
    pUVar16 = sprepTrie;
    if (start == end) {
      pUVar9 = unaff_RBX;
      uVar3 = utrie_get32_63(sprepTrie,start,(UBool *)0x0);
      if (uVar3 == 0) goto LAB_0010a3f7;
      if (type != USPREP_PROHIBITED || 0xffef < uVar3) goto LAB_0010a3f0;
      uVar11 = uVar3 + 1 & 0xffff;
      if (uVar11 < 0xfff0) {
        pUVar16 = sprepTrie;
        UVar1 = utrie_set32_63(sprepTrie,start,uVar11);
        if (UVar1 != '\0') {
          return;
        }
        storeRange_cold_4();
        end = extraout_EDX;
        goto LAB_0010a3d8;
      }
      goto LAB_0010a41d;
    }
LAB_0010a3d8:
    pUVar9 = unaff_RBX;
    UVar1 = utrie_setRange32_63(pUVar16,start,end + 1,uVar12 & 0xffff,'\0');
    if (UVar1 != '\0') {
      return;
    }
    storeRange_cold_1();
    uVar3 = extraout_EAX;
LAB_0010a3f0:
    if (uVar3 == (uVar12 & 0xffff)) {
LAB_0010a3f7:
      pUVar9 = unaff_RBX;
      UVar1 = utrie_set32_63(sprepTrie,start,uVar12 & 0xffff);
      if (UVar1 != '\0') {
        return;
      }
      goto LAB_0010a416;
    }
  }
  else {
    storeRange_cold_6();
LAB_0010a416:
    storeRange_cold_5();
LAB_0010a41d:
    storeRange_cold_3();
  }
  pUVar15 = (UNewDataMemory *)((ulong)unaff_RBX & 0xffffffff);
  storeRange_cold_2();
  auStack_70._0_4_ = U_ZERO_ERROR;
  pUStack_88 = (UNewDataMemory *)0x10a44d;
  pUStack_48 = unaff_RBX;
  sVar6 = strlen((char *)pUVar9);
  pUStack_88 = (UNewDataMemory *)0x10a456;
  pUVar7 = (UNewDataMemory *)uprv_malloc_63(sVar6 + 100);
  auStack_70._4_4_ = 0xffffffff;
  pUVar14 = (UNewDataMemory *)(ulong)uVar12;
  if (hashTable != (UHashtable *)0x0) {
    pUStack_88 = (UNewDataMemory *)0x10a47b;
    pUStack_58 = pUVar15;
    iVar4 = uhash_count_63(hashTable);
    pUStack_88 = (UNewDataMemory *)0x10a48e;
    mappingData = (uint16_t *)uprv_calloc_63((long)mappingDataCapacity,2);
    iStack_64 = iVar4;
    if (iVar4 < 1) {
      pUVar13 = (UNewDataMemory *)0x0;
      pUVar18 = (UNewDataMemory *)0x1;
    }
    else {
      pUVar13 = (UNewDataMemory *)0x0;
      pUVar18 = (UNewDataMemory *)0x1;
      uVar12 = 0;
      iVar5 = 0;
      pUStack_50 = pUVar7;
      do {
        unaff_R12 = (undefined8 *)(ulong)uVar12;
        pUStack_88 = (UNewDataMemory *)0x10a4ca;
        pUVar8 = uhash_nextElement_63(hashTable,(int32_t *)(auStack_70 + 4));
        if (pUVar8 != (UHashElement *)0x0) {
          cStack_71 = pUVar18 == (UNewDataMemory *)0x4;
          uStack_5c = uVar12;
          do {
            UVar17 = (pUVar8->key).integer;
            unaff_R12 = (undefined8 *)(pUVar8->value).pointer;
            if (pUVar18 != (UNewDataMemory *)(ulong)uStack_5c) {
              if ((int)uStack_5c < 4) {
                indexes[(long)((long)&pUVar18->file + 2)] = (int)currentIndex;
                cVar2 = cStack_71;
              }
              else {
                cVar2 = '\0';
              }
              if (cVar2 != '\0') {
                pUVar13 = (UNewDataMemory *)(ulong)(uint)(int)currentIndex;
              }
              uStack_5c = (uint)pUVar18;
            }
            if (pUVar18 == (UNewDataMemory *)(ulong)(uint)(int)*(short *)(unaff_R12 + 1)) {
              uVar11 = (uint)(ushort)currentIndex;
              pErrorCode = (UNewDataMemory *)(ulong)uVar11;
              uVar12 = uVar11 * 4 + 2;
              pUVar14 = (UNewDataMemory *)(ulong)uVar12;
              iStack_60 = iVar5;
              pUVar7 = pUVar9;
              pUVar15 = pUVar13;
              if ((ushort)uVar12 < 0xfff1) {
                pUStack_88 = (UNewDataMemory *)0x10a56b;
                UStack_68 = UVar17;
                uVar3 = utrie_get32_63(sprepTrie,UVar17,(UBool *)0x0);
                if (uVar3 == 0) {
LAB_0010a585:
                  pUStack_88 = (UNewDataMemory *)0x10a598;
                  UVar1 = utrie_set32_63(sprepTrie,UStack_68,(uint)pUVar14 & 0xffff);
                  if (UVar1 != '\0') {
                    iVar5 = (int)currentIndex;
                    if (0x3fbe < *(short *)(unaff_R12 + 1) + iVar5) {
                      pUStack_88 = (UNewDataMemory *)0x10a847;
                      generateData_cold_2();
                      goto LAB_0010a847;
                    }
                    if ((UNewDataMemory *)0x3 < pUVar18) {
                      currentIndex = currentIndex + 1;
                      mappingData[iVar5] = (uint16_t)pUVar18;
                    }
                    pUStack_88 = (UNewDataMemory *)0x10a608;
                    u_memmove_63((UChar *)(mappingData + currentIndex),(UChar *)*unaff_R12,
                                 (int)*(short *)(unaff_R12 + 1));
                    currentIndex = currentIndex + *(short *)(unaff_R12 + 1);
                    pUVar7 = (UNewDataMemory *)(auStack_70 + 4);
                    pUVar14 = pUVar13;
                    pUVar15 = pUVar18;
                    pErrorCode = pUVar9;
                    if (currentIndex <= mappingDataCapacity) {
                      iVar5 = iStack_60 + 1;
                      goto LAB_0010a631;
                    }
                    goto LAB_0010a84c;
                  }
                  goto LAB_0010a851;
                }
                if (uVar3 == 0xfff2) {
                  pUVar14 = (UNewDataMemory *)(ulong)(uVar11 << 2 | 3);
                  pErrorCode = pUVar14;
                  goto LAB_0010a585;
                }
              }
              else {
LAB_0010a847:
                pUStack_88 = (UNewDataMemory *)0x10a84c;
                generateData_cold_5();
LAB_0010a84c:
                pUStack_88 = (UNewDataMemory *)0x10a851;
                generateData_cold_1();
LAB_0010a851:
                pUStack_88 = (UNewDataMemory *)0x10a856;
                generateData_cold_3();
              }
              pUStack_88 = (UNewDataMemory *)0x10a85f;
              generateData_cold_4();
              goto LAB_0010a85f;
            }
LAB_0010a631:
            pUStack_88 = (UNewDataMemory *)0x10a640;
            pUVar8 = uhash_nextElement_63(hashTable,(int32_t *)(auStack_70 + 4));
            uVar12 = uStack_5c;
          } while (pUVar8 != (UHashElement *)0x0);
        }
        pUVar18 = (UNewDataMemory *)((long)&pUVar18->file + 1);
        auStack_70._4_4_ = 0xffffffff;
        pUVar7 = pUStack_50;
      } while (iVar5 < iStack_64);
    }
    pUVar14 = pUVar13;
    pUVar15 = pUStack_58;
    if ((uint)pUVar18 < 4) {
      indexes[((ulong)pUVar18 & 0xffffffff) + 2] = currentIndex + 1;
    }
    else {
      indexes[6] = (int32_t)pUVar13;
    }
  }
  pUStack_88 = (UNewDataMemory *)0x10a6ce;
  uVar12 = utrie_serialize_63(sprepTrie,generateData::sprepTrieBlock,100000,getFoldedValue,'\x01',
                              (UErrorCode *)auStack_70);
  pErrorCode = pUVar9;
  if ((int)auStack_70._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) {
    unaff_R12 = (undefined8 *)(ulong)uVar12;
    uVar11 = uVar12 + mappingDataCapacity * 2 + 0x40;
    pUVar14 = (UNewDataMemory *)(ulong)uVar11;
    if (beVerbose != '\0') {
      pUStack_88 = (UNewDataMemory *)0x10a707;
      printf("size of sprep trie              %5u bytes\n",unaff_R12);
      pUStack_88 = (UNewDataMemory *)0x10a71b;
      printf("size of icudt63l_%s.spp contents: %ld bytes\n",pUVar9,(long)(int)uVar11);
      pUStack_88 = (UNewDataMemory *)0x10a731;
      printf("size of mapping data array %5u bytes\n",(ulong)(uint)(mappingDataCapacity * 2));
      pUStack_88 = (UNewDataMemory *)0x10a746;
      printf("Number of code units in mappingData (currentIndex) are: %i \n",
             (ulong)(uint)(int)currentIndex);
      pUStack_88 = (UNewDataMemory *)0x10a75a;
      printf("Maximum length of the mapping string is : %i \n",(ulong)(uint)maxLength);
    }
    *(byte *)&pUVar7->file = 0;
    pUStack_88 = (UNewDataMemory *)0x10a768;
    strcat((char *)pUVar7,(char *)pUVar9);
    comment = (char *)0x0;
    if (haveCopyright != '\0') {
      comment = 
      " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
      ;
    }
    pErrorCode = (UNewDataMemory *)auStack_70;
    pUStack_88 = (UNewDataMemory *)0x10a7a1;
    pUVar9 = udata_create((char *)pUVar15,"spp",(char *)pUVar7,&dataInfo,comment,
                          (UErrorCode *)pErrorCode);
    if (U_ZERO_ERROR < (int)auStack_70._0_4_) goto LAB_0010a869;
    indexes[1] = mappingDataCapacity * 2;
    pUStack_88 = (UNewDataMemory *)0x10a7d8;
    indexes[0] = uVar12;
    udata_writeBlock(pUVar9,indexes,0x40);
    pUStack_88 = (UNewDataMemory *)0x10a7ea;
    udata_writeBlock(pUVar9,generateData::sprepTrieBlock,uVar12);
    pUStack_88 = (UNewDataMemory *)0x10a7ff;
    udata_writeBlock(pUVar9,mappingData,indexes[1]);
    pErrorCode = (UNewDataMemory *)auStack_70;
    pUStack_88 = (UNewDataMemory *)0x10a80f;
    uVar12 = udata_finish(pUVar9,(UErrorCode *)pErrorCode);
    if ((int)auStack_70._0_4_ < U_ILLEGAL_ARGUMENT_ERROR) {
      if (uVar12 == uVar11) {
        if (hashTable != (UHashtable *)0x0) {
          pUStack_88 = (UNewDataMemory *)0x10a82b;
          uhash_close_63(hashTable);
        }
        pUStack_88 = (UNewDataMemory *)0x10a833;
        uprv_free_63(pUVar7);
        return;
      }
      goto LAB_0010a87d;
    }
  }
  else {
LAB_0010a85f:
    pUStack_88 = (UNewDataMemory *)0x10a869;
    generateData_cold_9();
LAB_0010a869:
    pUVar9 = pUVar15;
    pUStack_88 = (UNewDataMemory *)0x10a873;
    generateData_cold_8();
  }
  pUStack_88 = (UNewDataMemory *)0x10a87d;
  generateData_cold_7();
  uVar12 = extraout_EAX_00;
LAB_0010a87d:
  pUVar16 = (UNewTrie *)(ulong)uVar12;
  UVar17 = (UChar32)pUVar14;
  pUStack_88 = (UNewDataMemory *)getFoldedValue;
  generateData_cold_6();
  iVar5 = UVar17 + 0x400;
  pUStack_a8 = pUVar7;
  puStack_a0 = unaff_R12;
  pUStack_98 = pUVar9;
  pUStack_90 = pErrorCode;
  pUStack_88 = pUVar14;
  while( true ) {
    uVar3 = utrie_get32_63(pUVar16,UVar17,&cStack_a9);
    iVar10 = 0x20;
    if ((cStack_a9 == '\0') && (iVar10 = 1, uVar3 != 0)) break;
    UVar17 = UVar17 + iVar10;
    if (iVar5 <= UVar17) {
      return;
    }
  }
  return;
}

Assistant:

extern void
storeRange(uint32_t start, uint32_t end, UStringPrepType type,UErrorCode* status){
    uint16_t trieWord = 0;

    if((int)(_SPREP_TYPE_THRESHOLD + type) > 0xFFFF){
        fprintf(stderr,"trieWord cannot contain value greater than 0xFFFF.\n");
        exit(U_ILLEGAL_CHAR_FOUND);
    }
    trieWord = (_SPREP_TYPE_THRESHOLD + type); /* the top 4 bits contain the value */
    if(start == end){
        uint32_t savedTrieWord = utrie_get32(sprepTrie, start, NULL);
        if(savedTrieWord>0){
            if(savedTrieWord < _SPREP_TYPE_THRESHOLD && type == USPREP_PROHIBITED){
                /* 
                 * A mapping is stored in the trie word 
                 * and the only other possible type that a 
                 * code point can have is USPREP_PROHIBITED
                 *
                 */

                /* turn on the 0th bit in the savedTrieWord */
                savedTrieWord += 0x01;

                /* the downcast is safe since we only save 16 bit values */
                trieWord = (uint16_t)savedTrieWord;

                /* make sure that the value of trieWord is less than the threshold */
                if(trieWord < _SPREP_TYPE_THRESHOLD){   
                    /* now set the value in the trie */
                    if(!utrie_set32(sprepTrie,start,trieWord)){
                        fprintf(stderr,"Could not set the value for code point.\n");
                        exit(U_ILLEGAL_ARGUMENT_ERROR);   
                    }
                    /* value is set so just return */
                    return;
                }else{
                    fprintf(stderr,"trieWord cannot contain value greater than threshold 0x%04X.\n",_SPREP_TYPE_THRESHOLD);
                    exit(U_ILLEGAL_CHAR_FOUND);
                }
 
            }else if(savedTrieWord != trieWord){
                fprintf(stderr,"Value for codepoint \\U%08X already set!.\n", (int)start);
                exit(U_ILLEGAL_ARGUMENT_ERROR);
            }
            /* if savedTrieWord == trieWord .. fall through and set the value */
        }
        if(!utrie_set32(sprepTrie,start,trieWord)){
            fprintf(stderr,"Could not set the value for code point \\U%08X.\n", (int)start);
            exit(U_ILLEGAL_ARGUMENT_ERROR);   
        }
    }else{
        if(!utrie_setRange32(sprepTrie, start, end+1, trieWord, FALSE)){
            fprintf(stderr,"Value for certain codepoint already set.\n");
            exit(U_ILLEGAL_CHAR_FOUND);   
        }
    }

}